

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_positionals_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  allocator<char> local_a9;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_90;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:35:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:35:26)>
             ::_M_manager;
  App::get_options(&opts,app,(function<bool_(const_CLI::Option_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  if (opts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      opts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Positionals",&local_a9);
    FormatterBase::get_label(&local_58,&this->super_FormatterBase,&local_78);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_90,&opts)
    ;
    (*(this->super_FormatterBase)._vptr_FormatterBase[3])
              (__return_storage_ptr__,this,&local_58,1,&local_90);
    std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
              (&local_90);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
            (&opts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return std::string();

    return make_group(get_label("Positionals"), true, opts);
}